

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

cio_error bs_read_at_least_immediate_error
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  return CIO_ADDRESS_IN_USE;
}

Assistant:

static enum cio_error bs_read_at_least_immediate_error(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	(void)buffered_stream;
	(void)buffer;
	(void)num;
	(void)handler;
	(void)handler_context;

	return CIO_ADDRESS_IN_USE;
}